

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O0

void AddFormatsToMetaMetaInfo(SstStream Stream,_TimestepMetadataMsg *Msg)

{
  void *pvVar1;
  undefined8 *puVar2;
  long in_RSI;
  long in_RDI;
  _SstMetaMetaBlockInternal *NewInfo;
  FFSFormatList Formats;
  undefined8 *local_18;
  
  for (local_18 = *(undefined8 **)(in_RSI + 0x18); local_18 != (undefined8 *)0x0;
      local_18 = (undefined8 *)local_18[4]) {
    pvVar1 = realloc(*(void **)(in_RDI + 0x270),(long)(*(int *)(in_RDI + 0x278) + 1) * 0x28);
    *(void **)(in_RDI + 0x270) = pvVar1;
    puVar2 = (undefined8 *)(*(long *)(in_RDI + 0x270) + (long)*(int *)(in_RDI + 0x278) * 0x28);
    *(int *)(in_RDI + 0x278) = *(int *)(in_RDI + 0x278) + 1;
    *puVar2 = *(undefined8 *)(in_RSI + 8);
    pvVar1 = malloc(local_18[3]);
    puVar2[3] = pvVar1;
    puVar2[4] = local_18[3];
    pvVar1 = malloc(local_18[1]);
    puVar2[1] = pvVar1;
    puVar2[2] = local_18[1];
    memcpy((void *)puVar2[3],(void *)local_18[2],local_18[3]);
    memcpy((void *)puVar2[1],(void *)*local_18,local_18[1]);
  }
  return;
}

Assistant:

void AddFormatsToMetaMetaInfo(SstStream Stream, struct _TimestepMetadataMsg *Msg)
{
    FFSFormatList Formats = Msg->Formats;
    STREAM_ASSERT_LOCKED(Stream);
    while (Formats)
    {
        Stream->InternalMetaMetaInfo =
            realloc(Stream->InternalMetaMetaInfo, (sizeof(struct _SstMetaMetaBlockInternal) *
                                                   (Stream->InternalMetaMetaCount + 1)));
        struct _SstMetaMetaBlockInternal *NewInfo =
            &Stream->InternalMetaMetaInfo[Stream->InternalMetaMetaCount];
        Stream->InternalMetaMetaCount++;
        NewInfo->TimestepAdded = Msg->Timestep;
        NewInfo->ID = malloc(Formats->FormatIDRepLen);
        NewInfo->IDSize = Formats->FormatIDRepLen;
        NewInfo->BlockData = malloc(Formats->FormatServerRepLen);
        NewInfo->BlockSize = Formats->FormatServerRepLen;
        memcpy(NewInfo->ID, Formats->FormatIDRep, Formats->FormatIDRepLen);
        memcpy(NewInfo->BlockData, Formats->FormatServerRep, Formats->FormatServerRepLen);
        Formats = Formats->Next;
    }
}